

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O1

void __thiscall boomphf::bfile_iterator<unsigned_long>::advance(bfile_iterator<unsigned_long> *this)

{
  size_t sVar1;
  
  this->_pos = this->_pos + 1;
  if (this->_inbuff <= this->_cptread) {
    sVar1 = fread(this->_buffer,8,(long)this->_buffsize,(FILE *)this->_is);
    this->_inbuff = (int)sVar1;
    this->_cptread = 0;
    if ((int)sVar1 == 0) {
      this->_is = (FILE *)0x0;
      this->_pos = 0;
      return;
    }
  }
  this->_elem = this->_buffer[this->_cptread];
  this->_cptread = this->_cptread + 1;
  return;
}

Assistant:

void advance()
		{
			
			//printf("_cptread %i _inbuff %i \n",_cptread,_inbuff);
			
			_pos++;
			
			if(_cptread >= _inbuff)
			{

				int res = fread(_buffer,sizeof(basetype),_buffsize,_is);

				//printf("read %i new elem last %llu  %p\n",res,_buffer[res-1],_is);
				_inbuff = res; _cptread = 0;
				
				if(res == 0)
				{
					_is = nullptr;
					_pos = 0;
					return;
				}
			}
			
			_elem = _buffer[_cptread];
			_cptread ++;
		}